

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

char * JS_AtomGetStrRT(JSRuntime *rt,char *buf,int buf_size,JSAtom atom)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  JSAtomStruct *unaff_R14;
  uint8_t *buf_00;
  
  if (buf_size < 0) {
    snprintf(buf,0x40,"%u",(ulong)(buf_size & 0x7fffffff));
    return buf;
  }
  if (buf_size == 0) {
    builtin_strncpy(buf,"<null>",7);
  }
  else {
    unaff_R14 = rt->atom_array[(uint)buf_size];
    buf_00 = (uint8_t *)buf;
    if (unaff_R14 != (JSAtomStruct *)0x0) {
      uVar2 = (uint)*(ulong *)&unaff_R14->field_0x4;
      if (-1 < (int)uVar2) {
        if ((*(ulong *)&unaff_R14->field_0x4 & 0x7fffffff) != 0) {
          uVar4 = 0;
          bVar5 = 0;
          do {
            bVar5 = bVar5 | *(byte *)((long)&unaff_R14[1].header.ref_count + uVar4);
            uVar4 = uVar4 + 1;
          } while ((uVar2 & 0x7fffffff) != uVar4);
          if (0x7f < bVar5) goto LAB_0011cd67;
        }
        unaff_R14 = unaff_R14 + 1;
        bVar1 = false;
        goto LAB_0011cdcd;
      }
LAB_0011cd67:
      uVar4 = *(ulong *)&unaff_R14->field_0x4;
      if ((uVar4 & 0x7fffffff) != 0) {
        uVar6 = 0;
        do {
          if ((int)uVar4 < 0) {
            uVar2 = (uint)*(ushort *)((long)&unaff_R14[1].header.ref_count + uVar6 * 2);
          }
          else {
            uVar2 = (uint)*(byte *)((long)&unaff_R14[1].header.ref_count + uVar6);
          }
          if (0x39 < (long)buf_00 - (long)buf) break;
          if (uVar2 < 0x80) {
            *buf_00 = (uint8_t)uVar2;
            buf_00 = buf_00 + 1;
          }
          else {
            iVar3 = unicode_to_utf8(buf_00,uVar2);
            buf_00 = buf_00 + iVar3;
          }
          uVar6 = uVar6 + 1;
          uVar4 = *(ulong *)&unaff_R14->field_0x4;
        } while (uVar6 < ((uint)uVar4 & 0x7fffffff));
      }
    }
    *buf_00 = '\0';
  }
  bVar1 = true;
LAB_0011cdcd:
  if (bVar1) {
    return buf;
  }
  return (char *)unaff_R14;
}

Assistant:

static const char *JS_AtomGetStrRT(JSRuntime *rt, char *buf, int buf_size,
                                   JSAtom atom)
{
    if (__JS_AtomIsTaggedInt(atom)) {
        snprintf(buf, buf_size, "%u", __JS_AtomToUInt32(atom));
    } else {
        JSAtomStruct *p;
        assert(atom < rt->atom_size);
        if (atom == JS_ATOM_NULL) {
            snprintf(buf, buf_size, "<null>");
        } else {
            int i, c;
            char *q;
            JSString *str;

            q = buf;
            p = rt->atom_array[atom];
            assert(!atom_is_free(p));
            str = p;
            if (str) {
                if (!str->is_wide_char) {
                    /* special case ASCII strings */
                    c = 0;
                    for(i = 0; i < str->len; i++) {
                        c |= str->u.str8[i];
                    }
                    if (c < 0x80)
                        return (const char *)str->u.str8;
                }
                for(i = 0; i < str->len; i++) {
                    if (str->is_wide_char)
                        c = str->u.str16[i];
                    else
                        c = str->u.str8[i];
                    if ((q - buf) >= buf_size - UTF8_CHAR_LEN_MAX)
                        break;
                    if (c < 128) {
                        *q++ = c;
                    } else {
                        q += unicode_to_utf8((uint8_t *)q, c);
                    }
                }
            }
            *q = '\0';
        }
    }
    return buf;
}